

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O0

IterateResult __thiscall
gl4cts::DirectStateAccess::Framebuffers::CreationTest::iterate(CreationTest *this)

{
  bool bVar1;
  bool bVar2;
  char cVar3;
  int iVar4;
  ContextType ctxType;
  ApiType requiredApiType;
  deUint32 dVar5;
  RenderContext *pRVar6;
  undefined4 extraout_var;
  ContextInfo *this_00;
  TestContext *pTVar8;
  TestLog *pTVar9;
  MessageBuilder *pMVar10;
  uint local_35c;
  undefined1 local_358 [4];
  GLuint i_2;
  uint local_1d4;
  undefined1 local_1d0 [4];
  GLuint i_1;
  uint local_50;
  GLuint i;
  int local_40 [2];
  GLuint framebuffers_dsa [2];
  GLuint framebuffers_legacy [2];
  bool is_error;
  bool is_ok;
  bool is_arb_direct_state_access;
  bool is_at_least_gl_45;
  Functions *gl;
  CreationTest *this_local;
  long lVar7;
  
  pRVar6 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar4 = (*pRVar6->_vptr_RenderContext[3])();
  lVar7 = CONCAT44(extraout_var,iVar4);
  pRVar6 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  ctxType.super_ApiType.m_bits = (ApiType)(*pRVar6->_vptr_RenderContext[2])();
  requiredApiType = glu::ApiType::core(4,5);
  bVar1 = glu::contextSupports(ctxType,requiredApiType);
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  bVar2 = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_direct_state_access");
  if ((bVar1) || (bVar2)) {
    bVar1 = true;
    framebuffers_dsa[0] = 0;
    framebuffers_dsa[1] = 0;
    local_40[0] = 0;
    local_40[1] = 0;
    (**(code **)(lVar7 + 0x6d0))(2,framebuffers_dsa);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"glGenFramebuffers has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0x6e);
    for (local_50 = 0; local_50 < 2; local_50 = local_50 + 1) {
      cVar3 = (**(code **)(lVar7 + 0xc88))(framebuffers_dsa[local_50]);
      if (cVar3 != '\0') {
        bVar1 = false;
        pTVar8 = deqp::Context::getTestContext((this->super_TestCase).m_context);
        pTVar9 = tcu::TestContext::getLog(pTVar8);
        tcu::TestLog::operator<<
                  ((MessageBuilder *)local_1d0,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar10 = tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)local_1d0,
                             (char (*) [80])
                             "GenFramebuffers has created default objects, but it should create only a names."
                            );
        tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_1d0);
      }
    }
    (**(code **)(lVar7 + 0x3c0))(2,local_40);
    dVar5 = (**(code **)(lVar7 + 0x800))();
    glu::checkError(dVar5,"glCreateFramebuffers has failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp"
                    ,0x80);
    for (local_1d4 = 0; local_1d4 < 2; local_1d4 = local_1d4 + 1) {
      cVar3 = (**(code **)(lVar7 + 0xc88))(framebuffers_dsa[(ulong)local_1d4 - 2]);
      if (cVar3 == '\0') {
        bVar1 = false;
        pTVar8 = deqp::Context::getTestContext((this->super_TestCase).m_context);
        pTVar9 = tcu::TestContext::getLog(pTVar8);
        tcu::TestLog::operator<<
                  ((MessageBuilder *)local_358,pTVar9,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar10 = tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)local_358,
                             (char (*) [52])"CreateFramebuffers has not created default objects.");
        tcu::MessageBuilder::operator<<(pMVar10,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_358);
      }
    }
    for (local_35c = 0; local_35c < 2; local_35c = local_35c + 1) {
      if (framebuffers_dsa[local_35c] != 0) {
        (**(code **)(lVar7 + 0x440))(1);
        framebuffers_dsa[local_35c] = 0;
      }
      if (framebuffers_dsa[(ulong)local_35c - 2] != 0) {
        (**(code **)(lVar7 + 0x440))(1);
        framebuffers_dsa[(ulong)local_35c - 2] = 0;
      }
    }
    do {
      iVar4 = (**(code **)(lVar7 + 0x800))();
    } while (iVar4 != 0);
    if (bVar1) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Fail");
    }
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"Not Supported");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult CreationTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	/* Framebuffers' objects */
	static const glw::GLuint framebuffers_count = 2;

	glw::GLuint framebuffers_legacy[framebuffers_count] = {};
	glw::GLuint framebuffers_dsa[framebuffers_count]	= {};

	try
	{
		/* Check legacy state creation. */
		gl.genFramebuffers(framebuffers_count, framebuffers_legacy);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers has failed");

		for (glw::GLuint i = 0; i < framebuffers_count; ++i)
		{
			if (gl.isFramebuffer(framebuffers_legacy[i]))
			{
				is_ok = false;

				/* Log. */
				m_context.getTestContext().getLog()
					<< tcu::TestLog::Message
					<< "GenFramebuffers has created default objects, but it should create only a names."
					<< tcu::TestLog::EndMessage;
			}
		}

		/* Check direct state creation. */
		gl.createFramebuffers(framebuffers_count, framebuffers_dsa);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateFramebuffers has failed");

		for (glw::GLuint i = 0; i < framebuffers_count; ++i)
		{
			if (!gl.isFramebuffer(framebuffers_dsa[i]))
			{
				is_ok = false;

				/* Log. */
				m_context.getTestContext().getLog() << tcu::TestLog::Message
													<< "CreateFramebuffers has not created default objects."
													<< tcu::TestLog::EndMessage;
			}
		}
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Cleanup. */
	for (glw::GLuint i = 0; i < framebuffers_count; ++i)
	{
		if (framebuffers_legacy[i])
		{
			gl.deleteFramebuffers(1, &framebuffers_legacy[i]);

			framebuffers_legacy[i] = 0;
		}

		if (framebuffers_dsa[i])
		{
			gl.deleteFramebuffers(1, &framebuffers_dsa[i]);

			framebuffers_dsa[i] = 0;
		}
	}

	/* Errors clean up. */
	while (gl.getError())
		;

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}